

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *p)

{
  string_view s;
  string_view s_00;
  bool bVar1;
  value_type pOVar2;
  FieldDescriptor *field;
  FieldGenerator *this_00;
  undefined1 in_R8B;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  string_view input;
  undefined1 auStack_1b8 [12];
  int i;
  value_type local_1a8;
  Printer *local_1a0;
  Formatter format;
  Iterator __begin4;
  Iterator __end4;
  Iterator __begin3;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O2__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  string local_108;
  Sub local_e8;
  
  i = 0;
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = *(int *)(__begin3.descriptor + 0x7c);
  local_1a0 = p;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar1 = cpp::operator!=(&__begin3,&__end3);
    if (!bVar1) break;
    pOVar2 = OneOfRangeImpl::Iterator::operator*(&__begin3);
    format.vars_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    format.vars_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    format.vars_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control = (ctrl_t *)google::protobuf::internal::TypeCardToString_abi_cxx11_;
    format.printer_ = p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"oneofname",(allocator<char> *)&__begin4);
    local_1a8 = pOVar2;
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              (&local_e8,&local_108,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar2 + 8));
    vars.len_ = 1;
    vars.ptr_ = &local_e8;
    io::Printer::WithVars(&v,local_1a0,vars);
    io::Printer::Sub::~Sub(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    Formatter::operator()<>
              (&format,
               "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
              );
    p = local_1a0;
    *(long *)(format.printer_ + 0x68) =
         *(long *)(format.printer_ + 0x68) + *(long *)(format.printer_ + 0x58);
    Formatter::operator()<>(&format,"$pbi$::TSanWrite(&_impl_);\n");
    Formatter::operator()<>(&format,"switch ($oneofname$_case()) {\n");
    *(long *)(format.printer_ + 0x68) =
         *(long *)(format.printer_ + 0x68) + *(long *)(format.printer_ + 0x58);
    __begin4.idx = 0;
    __begin4.descriptor = local_1a8;
    __end4.idx = *(int *)(local_1a8 + 4);
    __end4.descriptor = local_1a8;
    while( true ) {
      bVar1 = protobuf::internal::operator!=(&__begin4,&__end4);
      if (!bVar1) break;
      field = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
              operator*(&__begin4);
      input._M_str = (char *)0x1;
      input._M_len = **(size_t **)(field + 8);
      UnderscoresToCamelCase_abi_cxx11_
                (&local_e8.key_,(cpp *)(*(size_t **)(field + 8))[1],input,(bool)in_R8B);
      Formatter::operator()(&format,"case k$1$: {\n",&local_e8.key_);
      std::__cxx11::string::~string((string *)&local_e8);
      *(long *)(format.printer_ + 0x68) =
           *(long *)(format.printer_ + 0x68) + *(long *)(format.printer_ + 0x58);
      bVar1 = IsStringOrMessage(field);
      if (bVar1) {
        this_00 = FieldGeneratorTable::get(&this->field_generators_,field);
        FieldGenerator::GenerateClearingCode(this_00,p);
      }
      else {
        Formatter::operator()<>(&format,"// No need to clear\n");
      }
      Formatter::operator()<>(&format,"break;\n");
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>(&format,"}\n");
      __begin4.idx = __begin4.idx + 1;
    }
    s._M_str._4_4_ = i;
    s._0_12_ = auStack_1b8;
    absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(s);
    Formatter::operator()(&format,"case $1$_NOT_SET: {\n  break;\n}\n",&local_e8.key_);
    std::__cxx11::string::~string((string *)&local_e8);
    google::protobuf::io::Printer::Outdent();
    s_00._M_str._4_4_ = i;
    s_00._0_12_ = auStack_1b8;
    absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(s_00);
    Formatter::operator()(&format,"}\n$oneof_case$[$1$] = $2$_NOT_SET;\n",&i,&local_e8.key_);
    std::__cxx11::string::~string((string *)&local_e8);
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>(&format,"}\n\n");
    i = i + 1;
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&v);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&format.vars_);
    __begin3.idx = __begin3.idx + 1;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* p) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(p);
    auto v = p->WithVars({{"oneofname", oneof->name()}});

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("$pbi$::TSanWrite(&_impl_);\n");
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(p);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "$oneof_case$[$1$] = $2$_NOT_SET;\n",
        i, absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    ++i;
  }
}